

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_binary.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseBinary
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *lhs,
          Precedence minPrecedence)

{
  byte bVar1;
  TokenType TVar2;
  mapped_type mVar3;
  Lexer *tokOp;
  Token *pTVar4;
  Expr *pEVar5;
  pointer pcVar6;
  istream *piVar7;
  _Head_base<0UL,_pfederc::Expr_*,_false> _Var8;
  bool bVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  UnOpExpr *this_00;
  BiOpExpr *this_01;
  mapped_type *pmVar12;
  undefined8 uVar13;
  undefined2 uVar14;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  pointer __p;
  Lexer *pLVar15;
  Lexer *lexer;
  TokenType optype;
  TokenType local_a2;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_a0;
  undefined1 local_98 [40];
  _Head_base<0UL,_pfederc::UnOpExpr_*,_false> local_70;
  Lexer *local_68;
  undefined4 local_5c;
  Position local_58;
  undefined1 local_40 [16];
  
  local_98._32_8_ = CONCAT71(in_register_00000011,minPrecedence);
  pLVar15 = (lhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
            _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
  local_98._24_8_ = this;
  local_5c = in_ECX;
  do {
    TVar2 = *(TokenType *)&pLVar15->input;
    if (((ulong)TVar2 < 0x2d) && ((0x1000001c0006U >> ((ulong)TVar2 & 0x3f) & 1) != 0))
    goto LAB_00111b71;
    bVar9 = isTokenTypeOperator(TVar2);
    uVar14 = 0x42;
    if (bVar9) {
      uVar14 = *(undefined2 *)&pLVar15->input;
    }
    local_98._0_2_ = uVar14;
    cVar10 = std::
             _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)OPERATORS_INFO,(key_type *)local_98);
    if (cVar10.
        super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
LAB_00111bab:
      std::__throw_out_of_range("_Map_base::at");
LAB_00111bb7:
      uVar13 = std::__throw_out_of_range("_Map_base::at");
      __clang_call_terminate(uVar13);
    }
    if (*(int *)((long)cVar10.
                       super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
                       ._M_cur + 0x10) != 1) {
LAB_00111b71:
      *(Expr **)local_98._24_8_ =
           (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
            local_98._32_8_)->
           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
       local_98._32_8_)->super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>).
      _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)local_98._24_8_;
    }
    bVar1 = *(byte *)((long)cVar10.
                            super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
                            ._M_cur + 0x14);
    if (bVar1 < (byte)local_5c) goto LAB_00111b71;
    tokOp = (lhs->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
            _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
    bVar9 = isTokenTypeOperator(*(TokenType *)&tokOp->input);
    local_a2 = TOK_OP_NONE;
    if (bVar9) {
      local_a2 = *(TokenType *)&tokOp->input;
    }
    if (local_a2 != TOK_OP_NONE) goto LAB_001116b1;
    while (bVar9 = Token::operator==((Token *)(lhs->_M_t).
                                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                              .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                              _M_head_impl[3].lexer,TOK_EOL), bVar9) {
LAB_001116b1:
      Lexer::next((Lexer *)(lhs->_M_t).
                           super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                           .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    }
    local_a0._M_head_impl = (Expr *)0x0;
    cVar11 = std::
             _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)TOKEN_BRACKETS,&local_a2);
    if (cVar11.
        super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_58.line = 0;
      parsePrimary((Parser *)local_98,
                   (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *
                   )lhs);
      uVar13 = local_98._0_8_;
      _Var8._M_head_impl = local_a0._M_head_impl;
      local_98._0_8_ = (Lexer *)0x0;
      local_a0._M_head_impl = (Expr *)uVar13;
      if (((Lexer *)_Var8._M_head_impl != (Lexer *)0x0) &&
         ((*(_Var8._M_head_impl)->_vptr_Expr[1])(), (Lexer *)local_98._0_8_ != (Lexer *)0x0)) {
        (*(*(_func_int ***)local_98._0_8_)[1])();
      }
      local_98._0_8_ = (Lexer *)0x0;
      std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
      ~unique_ptr((unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
                  &local_58);
      if ((Lexer *)local_a0._M_head_impl == (Lexer *)0x0) {
        local_98._0_8_ = operator_new(0x38);
        pcVar6 = (pointer)(tokOp->filePath).field_2._M_allocated_capacity;
        *(Level *)&((Lexer *)local_98._0_8_)->_vptr_Lexer = LVL_ERROR;
        *(SyntaxErrorCode *)((long)&((Lexer *)local_98._0_8_)->_vptr_Lexer + 4) =
             STX_ERR_EXPECTED_PRIMARY_EXPR;
        piVar7 = (istream *)(tokOp->filePath)._M_string_length;
        ((Position *)&((Lexer *)local_98._0_8_)->cfg)->line =
             (size_t)(tokOp->filePath)._M_dataplus._M_p;
        ((Lexer *)local_98._0_8_)->input = piVar7;
        (((Lexer *)local_98._0_8_)->filePath)._M_dataplus._M_p = pcVar6;
        (((Lexer *)local_98._0_8_)->filePath)._M_string_length = 0;
        (((Lexer *)local_98._0_8_)->filePath).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(((Lexer *)local_98._0_8_)->filePath).field_2 + 8) = 0;
        generateError((Parser *)local_40,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)lhs);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_40);
        if ((Lexer *)local_98._0_8_ != (Lexer *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_98,
                     (Error<pfederc::SyntaxErrorCode> *)local_98._0_8_);
        }
LAB_00111b44:
        *(_func_int ***)local_98._24_8_ = (_func_int **)0x0;
        bVar9 = true;
      }
      else {
        while( true ) {
          pLVar15 = (lhs->_M_t).
                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
          TVar2 = *(TokenType *)&pLVar15->input;
          if (((ulong)TVar2 < 0x2d) && ((0x1000001c0006U >> ((ulong)TVar2 & 0x3f) & 1) != 0)) break;
          bVar9 = isTokenTypeOperator(TVar2);
          uVar14 = 0x42;
          if (bVar9) {
            uVar14 = *(undefined2 *)&pLVar15->input;
          }
          local_98._0_2_ = uVar14;
          cVar10 = std::
                   _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_std::allocator<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)OPERATORS_INFO,(key_type *)local_98);
          if (cVar10.
              super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
              ._M_cur == (__node_type *)0x0) goto LAB_00111bab;
          if ((*(int *)((long)cVar10.
                              super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
                              ._M_cur + 0x10) != 1) ||
             ((*(byte *)((long)cVar10.
                               super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
                               ._M_cur + 0x14) <= bVar1 &&
              ((*(byte *)((long)cVar10.
                                super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
                                ._M_cur + 0x14) != bVar1 ||
               (*(int *)((long)cVar10.
                               super__Node_iterator_base<std::pair<const_pfederc::TokenType,_const_std::tuple<unsigned_char,_pfederc::OperatorType,_pfederc::Associativity>_>,_false>
                               ._M_cur + 0xc) != 1)))))) break;
          local_68 = (Lexer *)local_a0._M_head_impl;
          local_a0._M_head_impl = (Expr *)0x0;
          parseBinary((Parser *)local_98,lhs,(Precedence)&local_68);
          _Var8._M_head_impl = local_a0._M_head_impl;
          local_a0._M_head_impl = (Expr *)local_98._0_8_;
          if (_Var8._M_head_impl != (Expr *)0x0) {
            (*(_Var8._M_head_impl)->_vptr_Expr[1])();
          }
          if (local_68 != (Lexer *)0x0) {
            (*local_68->_vptr_Lexer[1])();
          }
          local_68 = (Lexer *)0x0;
        }
        lexer = (Lexer *)(lhs->_M_t).
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
LAB_0011197a:
        Position::operator+(&((((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>
                                 *)local_98._32_8_)->
                              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                              )._M_t.
                              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                              .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->pos,
                            &(local_a0._M_head_impl)->pos);
        this_01 = (BiOpExpr *)operator_new(0x58);
        uVar13 = local_98._32_8_;
        BiOpExpr::BiOpExpr(this_01,lexer,(Position *)local_98,(Token *)tokOp,local_a2,
                           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           local_98._32_8_,
                           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           &local_a0);
        local_58.line = 0;
        pEVar5 = (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *
                   )uVar13)->
                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)uVar13)
        ->super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)this_01;
        if (pEVar5 != (Expr *)0x0) {
          (*pEVar5->_vptr_Expr[1])();
        }
        std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                   &local_58);
        bVar9 = false;
      }
    }
    else if ((local_a2 == TOK_OP_BRACKET_OPEN) &&
            (bVar9 = Token::operator==((Token *)(lhs->_M_t).
                                                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                                .super__Head_base<0UL,_pfederc::Expr_*,_false>.
                                                _M_head_impl[3].lexer,TOK_BRACKET_CLOSE), bVar9)) {
      pLVar15 = (Lexer *)(lhs->_M_t).
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      pTVar4 = pLVar15->currentToken;
      Lexer::next(pLVar15);
      pLVar15 = (Lexer *)(lhs->_M_t).
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      Position::operator+(&((((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>
                               *)local_98._32_8_)->
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            )._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->pos,
                          (Position *)&tokOp->filePath);
      Position::operator+(&local_58,&pTVar4->pos);
      this_00 = (UnOpExpr *)operator_new(0x48);
      uVar13 = local_98._32_8_;
      UnOpExpr::UnOpExpr(this_00,pLVar15,(Position *)local_98,(Token *)tokOp,
                         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                         local_98._32_8_);
      local_70._M_head_impl = (UnOpExpr *)0x0;
      pEVar5 = (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)
                uVar13)->super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>).
               _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      (((__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> *)uVar13)->
      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)this_00;
      if (pEVar5 != (Expr *)0x0) {
        (*pEVar5->_vptr_Expr[1])();
      }
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)&local_70
                );
      pLVar15 = (lhs->_M_t).
                super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer;
      bVar9 = false;
    }
    else {
      parseExpression((Parser *)local_98,(Precedence)lhs);
      uVar13 = local_98._0_8_;
      _Var8._M_head_impl = local_a0._M_head_impl;
      local_98._0_8_ = (Lexer *)0x0;
      local_a0._M_head_impl = (Expr *)uVar13;
      if (((Lexer *)_Var8._M_head_impl != (Lexer *)0x0) &&
         ((*(_Var8._M_head_impl)->_vptr_Expr[1])(), (Lexer *)local_98._0_8_ != (Lexer *)0x0)) {
        (*(*(_func_int ***)local_98._0_8_)[1])();
      }
      if ((Lexer *)local_a0._M_head_impl == (Lexer *)0x0) goto LAB_00111b44;
      cVar11 = std::
               _Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<pfederc::TokenType,_std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<pfederc::TokenType>,_std::hash<pfederc::TokenType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)TOKEN_BRACKETS,&local_a2);
      if (cVar11.
          super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>.
          _M_cur == (__node_type *)0x0) goto LAB_00111bb7;
      bVar9 = expect((Parser *)lhs,
                     *(TokenType *)
                      ((long)cVar11.
                             super__Node_iterator_base<std::pair<const_pfederc::TokenType,_pfederc::TokenType>,_false>
                             ._M_cur + 10));
      if (bVar9) {
        lexer = (Lexer *)(lhs->_M_t).
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        pLVar15 = (Lexer *)((Expr *)&lexer->currentToken)->_vptr_Expr;
        goto LAB_0011197a;
      }
      pmVar12 = std::
                map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                ::at((map<pfederc::TokenType,_pfederc::SyntaxErrorCode,_std::less<pfederc::TokenType>,_std::allocator<std::pair<const_pfederc::TokenType,_pfederc::SyntaxErrorCode>_>_>
                      *)STX_ERR_BRACKETS,&local_a2);
      Position::operator+((Position *)&tokOp->filePath,&(local_a0._M_head_impl)->pos);
      Position::operator+(&local_58,
                          (Position *)
                          &((lhs->_M_t).
                            super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                            .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl[3].lexer)->
                           filePath);
      local_70._M_head_impl = (UnOpExpr *)operator_new(0x38);
      mVar3 = *pmVar12;
      *(Level *)&((local_70._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
      *(mapped_type *)((long)&((local_70._M_head_impl)->super_Expr)._vptr_Expr + 4) = mVar3;
      ((Position *)&((local_70._M_head_impl)->super_Expr).parent)->line = local_98._0_8_;
      ((local_70._M_head_impl)->super_Expr).lexer = (Lexer *)local_98._8_8_;
      *(undefined8 *)&((local_70._M_head_impl)->super_Expr).type = local_98._16_8_;
      (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
       &((local_70._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data._M_start =
           (pointer)0x0;
      ((local_70._M_head_impl)->super_Expr).pos.startIndex = 0;
      ((local_70._M_head_impl)->super_Expr).pos.endIndex = 0;
      generateError((Parser *)(local_40 + 8),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)lhs);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 8));
      if (local_70._M_head_impl != (UnOpExpr *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_70,
                   (Error<pfederc::SyntaxErrorCode> *)local_70._M_head_impl);
      }
      *(_func_int ***)local_98._24_8_ = (_func_int **)0x0;
      bVar9 = true;
    }
    if ((Lexer *)local_a0._M_head_impl != (Lexer *)0x0) {
      (*(local_a0._M_head_impl)->_vptr_Expr[1])();
    }
    if (bVar9) {
      return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
             (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_98._24_8_;
    }
  } while( true );
}

Assistant:

std::unique_ptr<Expr> Parser::parseBinary(std::unique_ptr<Expr> lhs,
    Precedence minPrecedence) noexcept {
  Precedence prec{0};
  Token *lookahead = lexer.getCurrentToken();
  while (_binary_continue_condition(*lookahead, minPrecedence, prec)) {
    const Token *op = lexer.getCurrentToken();
    TokenType optype = _getOperatorType(*op);
    if (optype != TokenType::TOK_OP_NONE)
      lexer.next(); // advance to next unprocessed token
    
    // ignore newline tokens
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next();

    std::unique_ptr<Expr> rhs;
    if (TOKEN_BRACKETS.find(optype) != TOKEN_BRACKETS.end()) {
      if (optype == TokenType::TOK_OP_BRACKET_OPEN
          && *lexer.getCurrentToken() == TokenType::TOK_BRACKET_CLOSE) {
        // empty function call, because ()
        const Token *const closingBracket = lexer.getCurrentToken();
        lexer.next(); // eat )
        lhs = std::make_unique<UnOpExpr>(lexer,
          lhs->getPosition() + op->getPosition() + closingBracket->getPosition(),
          op, std::move(lhs));

        lookahead = lexer.getCurrentToken();

        continue;
      } else {
        rhs = parseExpression();
        if (!rhs)
          return nullptr;

        if (!expect(TOKEN_BRACKETS.at(optype))) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            STX_ERR_BRACKETS.at(optype),
            op->getPosition() + rhs->getPosition() +
            lexer.getCurrentToken()->getPosition()));
          return nullptr;
        }
      }

      lookahead = lexer.getCurrentToken();
    } else {
      rhs = parsePrimary();
      if (!rhs) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_PRIMARY_EXPR, op->getPosition()));
          
        return nullptr;
      }

      // lexer already on unprocessed token
      lookahead = lexer.getCurrentToken();
      Precedence innerPrec{0};
      while (_binary_inner_continue_condition(*lookahead, prec, innerPrec)) {
        rhs = parseBinary(std::move(rhs), innerPrec);
        lookahead = lexer.getCurrentToken();
      }
    }

    lhs = std::make_unique<BiOpExpr>(lexer,
      lhs->getPosition() + rhs->getPosition(),
      op, optype, std::move(lhs), std::move(rhs));
  }

  return lhs;
}